

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::GetFileSize
          (InMemoryEnv *this,string *fname,uint64_t *file_size)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  *in_RSI;
  FileState *in_RDI;
  long in_FS_OFFSET;
  MutexLock lock;
  key_type *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  Slice *in_stack_ffffffffffffff68;
  FileState *__k;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __k = in_RDI;
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff58,(Mutex *)0x18d6b58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
          *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
         *)in_stack_ffffffffffffff60);
  bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68,(_Self *)in_stack_ffffffffffffff60);
  if (bVar2) {
    Slice::Slice(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Slice::Slice(in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
    Status::IOError((Slice *)in_stack_ffffffffffffff60,(Slice *)in_stack_ffffffffffffff58);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
    ::operator[](in_RSI,(key_type *)__k);
    uVar3 = FileState::Size(in_RDI);
    *in_RCX = uVar3;
    Status::OK();
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)__k;
  }
  __stack_chk_fail();
}

Assistant:

Status GetFileSize(const std::string& fname, uint64_t* file_size) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      return Status::IOError(fname, "File not found");
    }

    *file_size = file_map_[fname]->Size();
    return Status::OK();
  }